

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icon.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  size_t __size;
  char *__ptr;
  
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    __ptr = "Failed to initialize GLFW\n";
    __size = 0x1a;
  }
  else {
    handle = glfwCreateWindow(200,200,"Window Icon",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      gladLoadGLLoader(glfwGetProcAddress);
      glfwSetKeyCallback(handle,key_callback);
      set_icon(handle,cur_icon_color);
      iVar1 = glfwWindowShouldClose(handle);
      while (iVar1 == 0) {
        (*glad_glClear)(0x4000);
        glfwSwapBuffers(handle);
        glfwWaitEvents();
        iVar1 = glfwWindowShouldClose(handle);
      }
      glfwDestroyWindow(handle);
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
    __ptr = "Failed to open GLFW window\n";
    __size = 0x1b;
  }
  fwrite(__ptr,__size,1,_stderr);
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    GLFWwindow* window;

    if (!glfwInit())
    {
        fprintf(stderr, "Failed to initialize GLFW\n");
        exit(EXIT_FAILURE);
    }

    window = glfwCreateWindow(200, 200, "Window Icon", NULL, NULL);
    if (!window)
    {
        glfwTerminate();

        fprintf(stderr, "Failed to open GLFW window\n");
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);

    glfwSetKeyCallback(window, key_callback);
    set_icon(window, cur_icon_color);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);
        glfwSwapBuffers(window);
        glfwWaitEvents();
    }

    glfwDestroyWindow(window);
    glfwTerminate();
    exit(EXIT_SUCCESS);
}